

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O0

void __thiscall Pl_AES_PDF::flush(Pl_AES_PDF *this,bool strip_padding)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  logic_error *this_00;
  Pipeline *pPVar4;
  element_type *peVar5;
  pointer puVar6;
  uint local_34;
  uint i;
  bool strip;
  uchar last;
  uint bytes;
  bool return_after_init;
  bool strip_padding_local;
  Pl_AES_PDF *this_local;
  
  if (this->offset != 0x10) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"AES pipeline: flush called when buffer was not full");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((this->first & 1U) != 0) {
    this->first = false;
    bVar3 = false;
    if ((this->cbc_mode & 1U) != 0) {
      if ((this->encrypt & 1U) == 0) {
        if (((this->use_zero_iv & 1U) == 0) && ((this->use_specified_iv & 1U) == 0)) {
          *(undefined8 *)this->cbc_block = *(undefined8 *)this->inbuf;
          *(undefined8 *)(this->cbc_block + 8) = *(undefined8 *)(this->inbuf + 8);
          this->offset = 0;
          bVar3 = true;
        }
        else {
          initializeVector(this);
        }
      }
      else {
        initializeVector(this);
        if (((this->use_zero_iv & 1U) == 0) && ((this->use_specified_iv & 1U) == 0)) {
          pPVar4 = Pipeline::next(&this->super_Pipeline);
          (*pPVar4->_vptr_Pipeline[2])(pPVar4,this->cbc_block,0x10);
        }
      }
    }
    peVar5 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->crypto);
    bVar1 = this->encrypt;
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->key);
    (*peVar5->_vptr_QPDFCryptoImpl[0xe])
              (peVar5,(ulong)(bVar1 & 1),puVar6,this->key_bytes,(ulong)(this->cbc_mode & 1),
               this->cbc_block);
    if (bVar3) {
      return;
    }
  }
  peVar5 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->crypto);
  (*peVar5->_vptr_QPDFCryptoImpl[0xf])(peVar5,this->inbuf,this->outbuf);
  i = 0x10;
  if ((strip_padding) && (bVar2 = this->outbuf[0xf], bVar2 < 0x11)) {
    bVar3 = true;
    for (local_34 = 1; local_34 <= bVar2; local_34 = local_34 + 1) {
      if (this->outbuf[0x10 - local_34] != bVar2) {
        bVar3 = false;
        break;
      }
    }
    if (bVar3) {
      i = 0x10 - bVar2;
    }
  }
  this->offset = 0;
  pPVar4 = Pipeline::next(&this->super_Pipeline);
  (*pPVar4->_vptr_Pipeline[2])(pPVar4,this->outbuf,(ulong)i);
  return;
}

Assistant:

void
Pl_AES_PDF::flush(bool strip_padding)
{
    if (this->offset != this->buf_size) {
        throw std::logic_error("AES pipeline: flush called when buffer was not full");
    }

    if (first) {
        first = false;
        bool return_after_init = false;
        if (this->cbc_mode) {
            if (encrypt) {
                // Set cbc_block to the initialization vector, and if not zero, write it to the
                // output stream.
                initializeVector();
                if (!(this->use_zero_iv || this->use_specified_iv)) {
                    next()->write(this->cbc_block, this->buf_size);
                }
            } else if (this->use_zero_iv || this->use_specified_iv) {
                // Initialize vector with zeroes; zero vector was not written to the beginning of
                // the input file.
                initializeVector();
            } else {
                // Take the first block of input as the initialization vector.  There's nothing to
                // write at this time.
                memcpy(this->cbc_block, this->inbuf, this->buf_size);
                this->offset = 0;
                return_after_init = true;
            }
        }
        this->crypto->rijndael_init(
            encrypt, this->key.get(), key_bytes, this->cbc_mode, this->cbc_block);
        if (return_after_init) {
            return;
        }
    }

    this->crypto->rijndael_process(this->inbuf, this->outbuf);
    unsigned int bytes = this->buf_size;
    if (strip_padding) {
        unsigned char last = this->outbuf[this->buf_size - 1];
        if (last <= this->buf_size) {
            bool strip = true;
            for (unsigned int i = 1; i <= last; ++i) {
                if (this->outbuf[this->buf_size - i] != last) {
                    strip = false;
                    break;
                }
            }
            if (strip) {
                bytes -= last;
            }
        }
    }
    this->offset = 0;
    next()->write(this->outbuf, bytes);
}